

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

void __thiscall siamese::Decoder::Decoder(Decoder *this)

{
  LightVector<siamese::RecoveryMatrixState::RowInfo,_25U> *pLVar1;
  LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U> *pLVar2;
  CheckedRegionState *pCVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  
  pktalloc::Allocator::Allocator(&this->TheAllocator);
  *(undefined8 *)((long)&(this->CheckedRegion).LastRecovery + 5) = 0;
  *(undefined8 *)((long)&(this->CheckedRegion).RecoveryCount + 1) = 0;
  (this->CheckedRegion).FirstRecovery = (RecoveryPacket *)0x0;
  (this->CheckedRegion).LastRecovery = (RecoveryPacket *)0x0;
  auVar15 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->RecoveryPackets).TheAllocator = (Allocator *)auVar15._0_8_;
  (this->RecoveryPackets).CheckedRegion = (CheckedRegionState *)auVar15._8_8_;
  (this->RecoveryPackets).Head = (RecoveryPacket *)auVar15._16_8_;
  (this->RecoveryPackets).Tail = (RecoveryPacket *)auVar15._24_8_;
  (this->RecoveryPackets).RecoveryPacketCount = 0;
  (this->Window).Subwindows.Size = 0;
  (this->Stats).Counts[0] = 0;
  (this->Stats).Counts[1] = 0;
  (this->Stats).Counts[2] = 0;
  (this->Stats).Counts[3] = 0;
  (this->Stats).Counts[4] = 0;
  (this->Stats).Counts[5] = 0;
  (this->Stats).Counts[6] = 0;
  (this->Stats).Counts[7] = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x24) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x2c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x34) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x3c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x44) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x4c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x54) = 0;
  *(undefined8 *)((long)&(this->CheckedRegion).RecoveryMatrix + 4) = 0;
  *(undefined1 (*) [32])&(this->RecoveryPackets).LastRecoveryBytes = auVar15;
  *(undefined1 (*) [32])((long)&(this->Window).CheckedRegion + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Window).Subwindows.Allocated = 0x19;
  (this->Window).Subwindows.DataPtr = (this->Window).Subwindows.PreallocatedData;
  lVar6 = 0x3a0;
  do {
    *(undefined4 *)((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + 8) = 0;
    puVar4 = (undefined8 *)
             ((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + -8);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4 = (undefined8 *)
             ((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + 0x10);
    *puVar4 = 0;
    puVar4[1] = 0;
    *(undefined4 *)((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + 0x20) = 0
    ;
    puVar4 = (undefined8 *)
             ((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + 0x28);
    *puVar4 = 0;
    puVar4[1] = 0;
    *(undefined4 *)((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar6 + 0x38) = 0
    ;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x5e0);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar11 = vpbroadcastq_avx512f(ZEXT816(0x19));
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0x80));
  (this->Window).SumColumnStart = 0;
  (this->Window).SumColumnCount = 0;
  lVar6 = 0;
  (this->Window).RecoveredPackets.Size = 0;
  (this->Window).RecoveredPackets.Allocated = 0x19;
  (this->Window).RecoveredPackets.DataPtr = (this->Window).RecoveredPackets.PreallocatedData;
  (this->Window).HasRecoveredPackets = false;
  (this->Window).RecoveredColumns.Size = 0;
  (this->Window).RecoveredColumns.Allocated = 0x19;
  (this->Window).RecoveredColumns.DataPtr = (this->Window).RecoveredColumns.PreallocatedData;
  (this->Window).SubwindowsShift.Size = 0;
  (this->Window).SubwindowsShift.Allocated = 0x19;
  (this->Window).SubwindowsShift.DataPtr = (this->Window).SubwindowsShift.PreallocatedData;
  pLVar1 = &(this->RecoveryMatrix).Rows;
  (this->Window).EmergencyDisabled = false;
  auVar13 = vpbroadcastq_avx512f();
  do {
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vporq_avx512f(auVar14,auVar10);
    uVar5 = vpcmpuq_avx512f(auVar14,auVar11,1);
    auVar14 = vpaddq_avx512f(auVar13,auVar9);
    vpscatterqq_avx512f(ZEXT864(pLVar1) + auVar9,uVar5,ZEXT1664((undefined1  [16])0x0));
    if ((uVar5 & 1) != 0) {
      *(undefined1 *)(auVar14._0_8_ + 8) = 0;
    }
    if ((uVar5 & 2) != 0) {
      lVar7 = vpextrq_avx(auVar14._0_16_,1);
      *(undefined1 *)(lVar7 + 8) = 0;
    }
    if ((uVar5 & 4) != 0) {
      *(undefined1 *)(auVar14._16_8_ + 8) = 0;
    }
    if ((uVar5 & 8) != 0) {
      lVar7 = vpextrq_avx(auVar14._16_16_,1);
      *(undefined1 *)(lVar7 + 8) = 0;
    }
    auVar8 = vextracti32x4_avx512f(auVar14,2);
    if ((uVar5 & 0x10) != 0) {
      *(undefined1 *)(auVar8._0_8_ + 8) = 0;
    }
    if ((uVar5 & 0x20) != 0) {
      lVar7 = vpextrq_avx(auVar8,1);
      *(undefined1 *)(lVar7 + 8) = 0;
    }
    auVar8 = vextracti32x4_avx512f(auVar14,3);
    if ((uVar5 & 0x40) != 0) {
      *(undefined1 *)(auVar8._0_8_ + 8) = 0;
    }
    if ((uVar5 & 0x80) != 0) {
      lVar7 = vpextrq_avx(auVar8,1);
      *(undefined1 *)(lVar7 + 8) = 0;
    }
    lVar6 = lVar6 + 8;
    auVar9 = vpaddq_avx512f(auVar9,auVar12);
    vpscatterqd_avx512f(ZEXT832(0xc) + auVar14._0_32_,uVar5,
                        SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  } while (lVar6 != 0x20);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
  pLVar2 = &(this->RecoveryMatrix).Columns;
  (this->RecoveryMatrix).Rows.Size = 0;
  (this->RecoveryMatrix).Rows.Allocated = 0x19;
  (this->RecoveryMatrix).Rows.DataPtr = pLVar1->PreallocatedData;
  lVar6 = 0;
  auVar13 = vpbroadcastq_avx512f();
  do {
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vporq_avx512f(auVar14,auVar10);
    uVar5 = vpcmpuq_avx512f(auVar14,auVar11,1);
    auVar14 = vpaddq_avx512f(auVar13,auVar9);
    vpscatterqq_avx512f(ZEXT864(pLVar2) + auVar9,uVar5,ZEXT1664((undefined1  [16])0x0));
    vpscatterqd_avx512f(ZEXT832(8) + auVar14._0_32_,uVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                       );
    if ((uVar5 & 1) != 0) {
      *(undefined1 *)(auVar14._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 2) != 0) {
      lVar7 = vpextrq_avx(auVar14._0_16_,1);
      *(undefined1 *)(lVar7 + 0xc) = 0;
    }
    if ((uVar5 & 4) != 0) {
      *(undefined1 *)(auVar14._16_8_ + 0xc) = 0;
    }
    if ((uVar5 & 8) != 0) {
      lVar7 = vpextrq_avx(auVar14._16_16_,1);
      *(undefined1 *)(lVar7 + 0xc) = 0;
    }
    auVar8 = vextracti32x4_avx512f(auVar14,2);
    if ((uVar5 & 0x10) != 0) {
      *(undefined1 *)(auVar8._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 0x20) != 0) {
      lVar7 = vpextrq_avx(auVar8,1);
      *(undefined1 *)(lVar7 + 0xc) = 0;
    }
    auVar8 = vextracti32x4_avx512f(auVar14,3);
    if ((uVar5 & 0x40) != 0) {
      *(undefined1 *)(auVar8._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 0x80) != 0) {
      lVar7 = vpextrq_avx(auVar8,1);
      *(undefined1 *)(lVar7 + 0xc) = 0;
    }
    lVar6 = lVar6 + 8;
    auVar9 = vpaddq_avx512f(auVar9,auVar12);
  } while (lVar6 != 0x20);
  pCVar3 = &this->CheckedRegion;
  (this->RecoveryMatrix).Columns.Size = 0;
  (this->RecoveryMatrix).Columns.Allocated = 0x19;
  (this->RecoveryMatrix).Columns.DataPtr = pLVar2->PreallocatedData;
  (this->RecoveryMatrix).PreviousNextCheckStart = 0;
  (this->RecoveryMatrix).Matrix.Data = (uint8_t *)0x0;
  (this->RecoveryMatrix).Matrix.Rows = 0;
  (this->RecoveryMatrix).Matrix.Columns = 0;
  (this->RecoveryMatrix).Matrix.AllocatedRows = 0;
  (this->RecoveryMatrix).Matrix.AllocatedColumns = 0;
  (this->RecoveryMatrix).Pivots.Size = 0;
  (this->RecoveryMatrix).Pivots.Allocated = 0x19;
  (this->RecoveryMatrix).Pivots.DataPtr = (this->RecoveryMatrix).Pivots.PreallocatedData;
  (this->RecoveryMatrix).GEResumePivot = 0;
  (this->ProductSum).Data = (uint8_t *)0x0;
  (this->ProductSum).Bytes = 0;
  this->LatestColumn = 0;
  (this->RecoveryPackets).TheAllocator = &this->TheAllocator;
  (this->RecoveryPackets).CheckedRegion = pCVar3;
  (this->Window).TheAllocator = &this->TheAllocator;
  (this->Window).Stats = &this->Stats;
  (this->Window).CheckedRegion = pCVar3;
  (this->Window).RecoveryPackets = &this->RecoveryPackets;
  (this->Window).RecoveryMatrix = &this->RecoveryMatrix;
  (this->RecoveryMatrix).TheAllocator = &this->TheAllocator;
  (this->RecoveryMatrix).Window = &this->Window;
  (this->RecoveryMatrix).CheckedRegion = pCVar3;
  (this->CheckedRegion).RecoveryMatrix = &this->RecoveryMatrix;
  return;
}

Assistant:

Decoder::Decoder()
{
    RecoveryPackets.TheAllocator  = &TheAllocator;
    RecoveryPackets.CheckedRegion = &CheckedRegion;
    Window.TheAllocator           = &TheAllocator;
    Window.Stats                  = &Stats;
    Window.CheckedRegion          = &CheckedRegion;
    Window.RecoveryPackets        = &RecoveryPackets;
    Window.RecoveryMatrix         = &RecoveryMatrix;
    RecoveryMatrix.TheAllocator   = &TheAllocator;
    RecoveryMatrix.Window         = &Window;
    RecoveryMatrix.CheckedRegion  = &CheckedRegion;
    CheckedRegion.RecoveryMatrix  = &RecoveryMatrix;
}